

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator * __thiscall
QMultiHash<int,QString>::emplace<QString_const&>
          (iterator *__return_storage_ptr__,void *this,int *key,QString *args)

{
  Data *pDVar1;
  Data<QHashPrivate::MultiNode<int,_QString>_> *pDVar2;
  long in_FS_OFFSET;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *this;
  if (pDVar1 == (Data *)0x0) {
    local_48.d.ptr = *(char16_t **)((long)this + 8);
LAB_004253f8:
    pDVar2 = *this;
    local_48.d.d = (Data *)pDVar1;
    if ((pDVar2 == (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_QString>_>::detached(pDVar2);
      *(Data<QHashPrivate::MultiNode<int,_QString>_> **)this = pDVar2;
    }
    emplace_helper<QString_const&>(__return_storage_ptr__,this,key,args);
    QMultiHash<int,_QString>::~QMultiHash((QMultiHash<int,_QString> *)&local_48);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_48.d.ptr = *(char16_t **)((long)this + 8);
      if ((pDVar1 != (Data *)0x0) &&
         ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_004253f8;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        emplace_helper<QString_const&>(__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_004254e4;
    }
    local_48.d.d = (args->d).d;
    local_48.d.ptr = (args->d).ptr;
    local_48.d.size = (args->d).size;
    if ((Data *)local_48.d.d != (Data *)0x0) {
      LOCK();
      (((QArrayData *)&((Data *)local_48.d.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&((Data *)local_48.d.d)->ref)->ref_)._q_value.super___atomic_base<int>.
           _M_i + 1;
      UNLOCK();
    }
    QMultiHash<int,_QString>::emplace_helper<QString>
              (__return_storage_ptr__,(QMultiHash<int,_QString> *)this,key,&local_48);
    if ((Data *)local_48.d.d != (Data *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_004254e4:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }